

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O2

void TPZShapeHCurl<pzshape::TPZShapeCube>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pair<int,_long> *ppVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long col;
  int i;
  long col_00;
  long lVar12;
  int d;
  long lVar13;
  long row;
  
  TPZShapeH1<pzshape::TPZShapeCube>::Shape(pt,data);
  for (col_00 = 0; col_00 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
      col_00 = col_00 + 1) {
    ppVar6 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
    col = (long)ppVar6[col_00].first;
    row = (long)(int)ppVar6[col_00].second;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pdVar8 = TPZFMatrix<double>::operator()(&(data->fPhi).super_TPZFMatrix<double>,row,0);
      dVar2 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&(data->fMasterDirections).super_TPZFMatrix<double>,lVar13,col);
      dVar3 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar13,col_00);
      *pdVar8 = dVar2 * dVar3;
    }
    lVar13 = 0;
    while (lVar13 != 3) {
      lVar1 = lVar13 + 1;
      lVar10 = 0;
      if (lVar1 != 3) {
        lVar10 = lVar1;
      }
      lVar11 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
               fRow * row;
      pdVar8 = (data->fDPhi).super_TPZFMatrix<double>.fElem;
      uVar9 = (ulong)((int)lVar13 - 1);
      if (lVar13 == 0) {
        uVar9 = 2;
      }
      lVar12 = (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
               super_TPZBaseMatrix.fRow * col;
      pdVar7 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
      dVar2 = pdVar7[lVar12 + lVar10];
      dVar3 = pdVar8[lVar11 + uVar9];
      dVar4 = pdVar8[lVar11 + lVar10];
      dVar5 = pdVar7[lVar12 + uVar9];
      pdVar8 = TPZFMatrix<double>::operator()(curlphi,lVar13,col_00);
      *pdVar8 = dVar4 * dVar5 - dVar2 * dVar3;
      lVar13 = lVar1;
    }
  }
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        const auto &it = data.fSDVecShapeIndex[i];
        const int vecindex = it.first;
        const int scalindex = it.second;
        
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
        }

        if constexpr (dim==1){
            curlphi(0,i) =
                data.fDPhi.GetVal( 0,vecindex) *
                data.fMasterDirections.GetVal(0,vecindex);
        }else if constexpr (dim==2){
            curlphi(0,i) =
                data.fDPhi.GetVal(0,scalindex) *
                data.fMasterDirections.GetVal(1,vecindex) -
                data.fDPhi.GetVal(1,scalindex) *
                data.fMasterDirections.GetVal(0,vecindex);
            }
        else if constexpr(dim==3){
            for(auto d = 0; d < dim; d++) {
                const auto di = (d+1)%dim;
                const auto dj = (d+2)%dim;
                curlphi(d,i) =
                    data.fDPhi.GetVal(di,scalindex) *
                    data.fMasterDirections.GetVal(dj,vecindex)-
                    data.fDPhi.GetVal(dj,scalindex) *
                    data.fMasterDirections.GetVal(di,vecindex);
            }
        }else{
            if constexpr (std::is_same_v<TSHAPE,TSHAPE>){
                static_assert(!sizeof(TSHAPE),"Invalid curl dimension");
            }
        }        
    }
}